

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O0

uchar * __thiscall CNetChunkHeader::Pack(CNetChunkHeader *this,uchar *pData)

{
  uchar *pData_local;
  CNetChunkHeader *this_local;
  uchar *local_8;
  
  *pData = (byte)((this->m_Flags & 3U) << 6) | (byte)(this->m_Size >> 6) & 0x3f;
  pData[1] = (byte)this->m_Size & 0x3f;
  if ((this->m_Flags & 1U) == 0) {
    local_8 = pData + 2;
  }
  else {
    pData[1] = pData[1] | (byte)(this->m_Sequence >> 2) & 0xc0;
    pData[2] = (uchar)this->m_Sequence;
    local_8 = pData + 3;
  }
  return local_8;
}

Assistant:

unsigned char *CNetChunkHeader::Pack(unsigned char *pData)
{
	pData[0] = ((m_Flags&0x03)<<6) | ((m_Size>>6)&0x3F);
	pData[1] = (m_Size&0x3F);
	if(m_Flags&NET_CHUNKFLAG_VITAL)
	{
		pData[1] |= (m_Sequence>>2)&0xC0;
		pData[2] = m_Sequence&0xFF;
		return pData + 3;
	}
	return pData + 2;
}